

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O1

int Io_ReadBlifNetworkOutputLoad(Io_ReadBlif_t *p,Vec_Ptr_t *vTokens)

{
  void **ppvVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  Abc_Obj_t *pAVar7;
  long lVar8;
  long lVar9;
  int Entry;
  char *pFoo2;
  char *pFoo1;
  char *local_30;
  char *local_28;
  
  ppvVar1 = vTokens->pArray;
  iVar6 = strncmp((char *)*ppvVar1,".output_load",0xc);
  if (iVar6 != 0) {
    __assert_fail("strncmp( (char *)vTokens->pArray[0], \".output_load\", 12 ) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                  ,0x456,"int Io_ReadBlifNetworkOutputLoad(Io_ReadBlif_t *, Vec_Ptr_t *)");
  }
  if (vTokens->nSize == 4) {
    pAVar7 = Abc_NtkFindNet(p->pNtkCur,(char *)ppvVar1[1]);
    if (pAVar7 == (Abc_Obj_t *)0x0) {
      iVar6 = Extra_FileReaderGetLineNumber(p->pReader,0);
      p->LineCur = iVar6;
      sprintf(p->sError,"Cannot find object corresponding to %s on .output_load line.",
              vTokens->pArray[1]);
    }
    else {
      dVar4 = strtod((char *)vTokens->pArray[2],&local_28);
      dVar5 = strtod((char *)vTokens->pArray[3],&local_30);
      if ((*local_28 == '\0') && (*local_30 == '\0')) {
        iVar6 = *(int *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray] + 0x10);
        if (-1 < (long)iVar6) {
          pVVar2 = p->pNtkCur->vObjs;
          if (iVar6 < pVVar2->nSize) {
            pVVar3 = p->pNtkCur->vPos;
            lVar8 = (long)pVVar3->nSize;
            Entry = -1;
            if (0 < lVar8) {
              lVar9 = 0;
              do {
                if (pVVar3->pArray[lVar9] == pVVar2->pArray[iVar6]) {
                  Entry = (int)lVar9;
                  break;
                }
                lVar9 = lVar9 + 1;
              } while (lVar8 != lVar9);
            }
            Vec_IntPush(p->vOutLoads,Entry);
            Vec_IntPush(p->vOutLoads,(int)(float)dVar4);
            Vec_IntPush(p->vOutLoads,(int)(float)dVar5);
            return 0;
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar6 = Extra_FileReaderGetLineNumber(p->pReader,0);
      p->LineCur = iVar6;
      sprintf(p->sError,"Bad value (%s %s) for rise or fall time on .output_load line.",
              vTokens->pArray[2],vTokens->pArray[3]);
    }
  }
  else {
    iVar6 = Extra_FileReaderGetLineNumber(p->pReader,0);
    p->LineCur = iVar6;
    builtin_strncpy(p->sError,"Wrong number of arguments on .output_load line.",0x30);
  }
  Io_ReadBlifPrintErrorMessage(p);
  return 1;
}

Assistant:

int Io_ReadBlifNetworkOutputLoad( Io_ReadBlif_t * p, Vec_Ptr_t * vTokens )
{
    Abc_Obj_t * pNet;
    char * pFoo1, * pFoo2;
    double TimeRise, TimeFall;
 
    // make sure this is indeed the .inputs line
    assert( strncmp( (char *)vTokens->pArray[0], ".output_load", 12 ) == 0 );
    if ( vTokens->nSize != 4 )
    {
        p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
        sprintf( p->sError, "Wrong number of arguments on .output_load line." );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }
    pNet = Abc_NtkFindNet( p->pNtkCur, (char *)vTokens->pArray[1] );
    if ( pNet == NULL )
    {
        p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
        sprintf( p->sError, "Cannot find object corresponding to %s on .output_load line.", (char*)vTokens->pArray[1] );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }
    TimeRise = strtod( (char *)vTokens->pArray[2], &pFoo1 );
    TimeFall = strtod( (char *)vTokens->pArray[3], &pFoo2 );
    if ( *pFoo1 != '\0' || *pFoo2 != '\0' )
    {
        p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
        sprintf( p->sError, "Bad value (%s %s) for rise or fall time on .output_load line.", (char*)vTokens->pArray[2], (char*)vTokens->pArray[3] );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }
    // set timing info
//    Abc_NtkTimeSetOutputLoad( p->pNtkCur, Io_ReadFindCoId(p->pNtkCur, Abc_NtkObj(p->pNtkCur, Abc_ObjFanout0(pNet)->Id)), (float)TimeRise, (float)TimeFall );
    Vec_IntPush( p->vOutLoads, Io_ReadFindCoId(p->pNtkCur, Abc_NtkObj(p->pNtkCur, Abc_ObjFanout0(pNet)->Id)) );
    Vec_IntPush( p->vOutLoads, Abc_Float2Int((float)TimeRise) );
    Vec_IntPush( p->vOutLoads, Abc_Float2Int((float)TimeFall) );
    return 0;
}